

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O1

TPZTransform<double> * __thiscall
TPZGeoEl::Projection(TPZTransform<double> *__return_storage_ptr__,TPZGeoEl *this,int side)

{
  int iVar1;
  TPZTransform<double> tr2;
  TPZTransform<double> tr;
  TPZTransform<double> TStack_358;
  TPZTransform<double> local_1b8;
  
  iVar1 = (**(code **)(*(long *)this + 0xf0))(this);
  (**(code **)(*(long *)this + 0x1d8))(&local_1b8,this,iVar1 + -1,side);
  iVar1 = (**(code **)(*(long *)this + 0xf0))(this);
  (**(code **)(*(long *)this + 0x1d8))(&TStack_358,this,side,iVar1 + -1);
  TPZTransform<double>::Multiply(__return_storage_ptr__,&TStack_358,&local_1b8);
  TPZTransform<double>::~TPZTransform(&TStack_358);
  TPZTransform<double>::~TPZTransform(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZGeoEl::Projection(int side)
{
	TPZTransform<> tr = SideToSideTransform(NSides()-1,side);
	TPZTransform<> tr2 = SideToSideTransform(side,NSides()-1);
	TPZTransform<> tr3 = tr2.Multiply(tr);
	//	std::cout << "interior to side " << side << " trans " << tr << std::endl;
	//	std::cout << "side to interior " << side << " trans " << tr2 << std::endl;
	//	std::cout << "side to side " << side << " trans " << tr3 << std::endl;
	return tr3;
}